

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

int __thiscall
Minisat::Solver::computeLBD<Minisat::vec<Minisat::Lit>>(Solver *this,vec<Minisat::Lit> *c)

{
  int iVar1;
  int iVar2;
  Lit *pLVar3;
  VarData *pVVar4;
  unsigned_long *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar6 = c->sz;
  if ((int)uVar6 <= this->max_lbd_calc_size) {
    iVar1 = (this->assumptions).sz;
    this->counter = this->counter + 1;
    pLVar3 = c->data;
    pVVar4 = (this->vardata).data;
    puVar5 = (this->seen2).data;
    uVar7 = 0;
    uVar8 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar8 = uVar7;
    }
    uVar6 = 0;
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      iVar2 = pVVar4[pLVar3[uVar7].x >> 1].level;
      if ((iVar1 < iVar2) && (puVar5[iVar2] != this->counter)) {
        puVar5[iVar2] = this->counter;
        uVar6 = uVar6 + 1;
      }
    }
  }
  return uVar6;
}

Assistant:

int size(void) const { return sz; }